

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

int absl::lts_20250127::base_internal::IntLog2(size_t size,size_t base)

{
  undefined8 local_28;
  size_t i;
  int result;
  size_t base_local;
  size_t size_local;
  
  i._4_4_ = 0;
  for (local_28 = size; base < local_28; local_28 = local_28 >> 1) {
    i._4_4_ = i._4_4_ + 1;
  }
  return i._4_4_;
}

Assistant:

static int IntLog2(size_t size, size_t base) {
  int result = 0;
  for (size_t i = size; i > base; i >>= 1) {  // i == floor(size/2**result)
    result++;
  }
  //    floor(size / 2**result) <= base < floor(size / 2**(result-1))
  // =>     log2(size/(base+1)) <= result < 1+log2(size/base)
  // => result ~= log2(size/base)
  return result;
}